

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_MeshFace::ComputeFaceNormal(ON_MeshFace *this,ON_3dPointListRef *vertex_list,ON_3dVector *FN)

{
  bool bVar1;
  ON_3dVector local_d0;
  ON_3dPoint local_b8;
  ON_3dPoint local_a0;
  undefined1 local_88 [8];
  ON_3dVector b;
  ON_3dPoint local_58;
  undefined1 local_40 [8];
  ON_3dVector a;
  ON_3dVector *FN_local;
  ON_3dPointListRef *vertex_list_local;
  ON_MeshFace *this_local;
  
  a.z = (double)FN;
  ON_3dPointListRef::operator[](&local_58,vertex_list,this->vi[2]);
  ON_3dPointListRef::operator[]((ON_3dPoint *)&b.z,vertex_list,this->vi[0]);
  ON_3dPoint::operator-((ON_3dVector *)local_40,&local_58,(ON_3dPoint *)&b.z);
  ON_3dPointListRef::operator[](&local_a0,vertex_list,this->vi[3]);
  ON_3dPointListRef::operator[](&local_b8,vertex_list,this->vi[1]);
  ON_3dPoint::operator-((ON_3dVector *)local_88,&local_a0,&local_b8);
  ON_CrossProduct(&local_d0,(ON_3dVector *)local_40,(ON_3dVector *)local_88);
  *(double *)a.z = local_d0.x;
  *(double *)((long)a.z + 8) = local_d0.y;
  *(double *)((long)a.z + 0x10) = local_d0.z;
  bVar1 = ON_3dVector::Unitize((ON_3dVector *)a.z);
  if (!bVar1) {
    *(double *)a.z = ON_3dVector::ZeroVector.x;
    *(double *)((long)a.z + 8) = ON_3dVector::ZeroVector.y;
    *(double *)((long)a.z + 0x10) = ON_3dVector::ZeroVector.z;
  }
  return bVar1;
}

Assistant:

bool ON_MeshFace::ComputeFaceNormal( const class ON_3dPointListRef& vertex_list, ON_3dVector& FN ) const
{
  ON_3dVector a = vertex_list[vi[2]] - vertex_list[vi[0]];
  ON_3dVector b = vertex_list[vi[3]] - vertex_list[vi[1]];
  FN = ON_CrossProduct( a, b ); // works for triangles, quads, and nonplanar quads
  if ( FN.Unitize() )
    return true;

  FN = ON_3dVector::ZeroVector;
  return false;
}